

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O3

void av1_calculate_tile_cols
               (SequenceHeader *seq_params,int cm_mi_rows,int cm_mi_cols,CommonTileParams *tiles)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  bVar4 = (byte)seq_params->mib_size_log2;
  uVar2 = ~(-1 << (bVar4 & 0x1f));
  iVar9 = (int)(uVar2 + cm_mi_cols) >> (bVar4 & 0x1f);
  iVar3 = (int)(uVar2 + cm_mi_rows) >> (bVar4 & 0x1f);
  iVar10 = -1;
  tiles->min_inner_width = -1;
  if (tiles->uniform_spacing == 0) {
    uVar2 = tiles->cols;
    do {
      iVar10 = iVar10 + 1;
    } while (1 << ((byte)iVar10 & 0x1f) < (int)uVar2);
    tiles->log2_cols = iVar10;
    if ((int)uVar2 < 1) {
      iVar8 = 0x10000;
      iVar10 = 1;
    }
    else {
      iVar10 = 1;
      iVar8 = 0x10000;
      uVar7 = 0;
      iVar6 = tiles->col_start_sb[0];
      do {
        lVar1 = uVar7 + 1;
        iVar6 = tiles->col_start_sb[lVar1] - iVar6;
        if (iVar10 <= iVar6) {
          iVar10 = iVar6;
        }
        if (iVar8 < iVar6) {
          iVar6 = iVar8;
        }
        if (uVar7 < uVar2 - 1) {
          iVar8 = iVar6;
        }
        uVar7 = uVar7 + 1;
        iVar6 = tiles->col_start_sb[lVar1];
      } while (uVar2 != uVar7);
    }
    bVar5 = (char)tiles->min_log2 + 1;
    if (tiles->min_log2 == 0) {
      bVar5 = 0;
    }
    iVar10 = (iVar3 * iVar9 >> (bVar5 & 0x1f)) / iVar10;
    iVar3 = 1;
    if (1 < iVar10) {
      iVar3 = iVar10;
    }
    tiles->max_height_sb = iVar3;
    if ((int)uVar2 < 2) {
      return;
    }
    iVar8 = iVar8 << (bVar4 & 0x1f);
  }
  else {
    iVar10 = tiles->log2_cols;
    bVar4 = (byte)iVar10;
    iVar8 = iVar9 + (1 << (bVar4 & 0x1f)) + -1 >> (bVar4 & 0x1f);
    uVar7 = 0;
    if (0 < iVar9) {
      uVar7 = 0;
      iVar6 = 0;
      do {
        tiles->col_start_sb[uVar7] = iVar6;
        iVar6 = iVar6 + iVar8;
        uVar7 = uVar7 + 1;
      } while (iVar6 < iVar9);
    }
    tiles->cols = (uint)uVar7;
    tiles->col_start_sb[uVar7 & 0xffffffff] = iVar9;
    iVar10 = tiles->min_log2 - iVar10;
    iVar9 = 0;
    if (0 < iVar10) {
      iVar9 = iVar10;
    }
    tiles->min_log2_rows = iVar9;
    tiles->max_height_sb = iVar3 >> ((byte)iVar9 & 0x1f);
    iVar8 = iVar8 << ((byte)seq_params->mib_size_log2 & 0x1f);
    if (cm_mi_cols <= iVar8) {
      iVar8 = cm_mi_cols;
    }
    tiles->width = iVar8;
    if ((uint)uVar7 < 2) {
      return;
    }
  }
  tiles->min_inner_width = iVar8;
  return;
}

Assistant:

void av1_calculate_tile_cols(const SequenceHeader *const seq_params,
                             int cm_mi_rows, int cm_mi_cols,
                             CommonTileParams *const tiles) {
  int sb_cols = CEIL_POWER_OF_TWO(cm_mi_cols, seq_params->mib_size_log2);
  int sb_rows = CEIL_POWER_OF_TWO(cm_mi_rows, seq_params->mib_size_log2);
  int i;

  // This will be overridden if there is at least two columns of tiles
  // (otherwise there is no inner tile width)
  tiles->min_inner_width = -1;

  if (tiles->uniform_spacing) {
    int start_sb;
    int size_sb = CEIL_POWER_OF_TWO(sb_cols, tiles->log2_cols);
    assert(size_sb > 0);
    for (i = 0, start_sb = 0; start_sb < sb_cols; i++) {
      tiles->col_start_sb[i] = start_sb;
      start_sb += size_sb;
    }
    tiles->cols = i;
    tiles->col_start_sb[i] = sb_cols;
    tiles->min_log2_rows = AOMMAX(tiles->min_log2 - tiles->log2_cols, 0);
    tiles->max_height_sb = sb_rows >> tiles->min_log2_rows;

    tiles->width = size_sb << seq_params->mib_size_log2;
    tiles->width = AOMMIN(tiles->width, cm_mi_cols);
    if (tiles->cols > 1) {
      tiles->min_inner_width = tiles->width;
    }
  } else {
    int max_tile_area_sb = (sb_rows * sb_cols);
    int widest_tile_sb = 1;
    int narrowest_inner_tile_sb = 65536;
    tiles->log2_cols = tile_log2(1, tiles->cols);
    for (i = 0; i < tiles->cols; i++) {
      int size_sb = tiles->col_start_sb[i + 1] - tiles->col_start_sb[i];
      widest_tile_sb = AOMMAX(widest_tile_sb, size_sb);
      // ignore the rightmost tile in frame for determining the narrowest
      if (i < tiles->cols - 1)
        narrowest_inner_tile_sb = AOMMIN(narrowest_inner_tile_sb, size_sb);
    }
    if (tiles->min_log2) {
      max_tile_area_sb >>= (tiles->min_log2 + 1);
    }
    tiles->max_height_sb = AOMMAX(max_tile_area_sb / widest_tile_sb, 1);
    if (tiles->cols > 1) {
      tiles->min_inner_width = narrowest_inner_tile_sb
                               << seq_params->mib_size_log2;
    }
  }
}